

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool __thiscall testing::TestResult::Failed(TestResult *this)

{
  bool bVar1;
  int iVar2;
  TestResult *in_RDI;
  int i;
  int iVar3;
  int i_00;
  TestResult *this_00;
  
  iVar3 = 0;
  this_00 = in_RDI;
  while( true ) {
    i_00 = iVar3;
    iVar2 = total_part_count((TestResult *)0x13376d);
    if (iVar2 <= iVar3) {
      return false;
    }
    GetTestPartResult(this_00,i_00);
    bVar1 = TestPartResult::failed((TestPartResult *)in_RDI);
    if (bVar1) break;
    iVar3 = i_00 + 1;
  }
  return true;
}

Assistant:

bool TestResult::Failed() const {
  for (int i = 0; i < total_part_count(); ++i) {
    if (GetTestPartResult(i).failed())
      return true;
  }
  return false;
}